

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txfm_common_avx2.h
# Opt level: O0

void transpose2_8x8_avx2(__m256i *in,__m256i *out)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  long lVar17;
  long lVar18;
  long in_RSI;
  long in_RDI;
  int i_2;
  int i_1;
  int i;
  __m256i u [16];
  __m256i t [16];
  int local_6ec;
  int local_6e8;
  int local_6e4;
  undefined8 local_6e0 [8];
  undefined1 auStack_6a0 [64];
  undefined8 auStack_660 [48];
  undefined8 local_4e0 [8];
  undefined8 auStack_4a0 [8];
  undefined8 auStack_460 [8];
  undefined8 auStack_420 [42];
  long local_2d0;
  long local_2c8;
  
  local_2d0 = in_RSI;
  local_2c8 = in_RDI;
  for (local_6e4 = 0; local_6e4 < 4; local_6e4 = local_6e4 + 1) {
    lVar18 = (long)(local_6e4 * 2) * 0x20;
    auVar1 = vpunpcklwd_avx2(*(undefined1 (*) [32])(local_2c8 + lVar18),
                             *(undefined1 (*) [32])(local_2c8 + 0x20 + lVar18));
    *(undefined1 (*) [32])(local_4e0 + (long)(local_6e4 * 2) * 4) = auVar1;
    lVar18 = (long)(local_6e4 * 2) * 0x20;
    auVar1 = vpunpckhwd_avx2(*(undefined1 (*) [32])(local_2c8 + lVar18),
                             *(undefined1 (*) [32])(local_2c8 + 0x20 + lVar18));
    *(undefined1 (*) [32])(local_4e0 + (long)(local_6e4 * 2 + 1) * 4) = auVar1;
  }
  for (local_6e8 = 0; local_6e8 < 2; local_6e8 = local_6e8 + 1) {
    lVar18 = (long)local_6e8;
    auVar5._8_8_ = local_4e0[lVar18 * 4 + 1];
    auVar5._0_8_ = local_4e0[lVar18 * 4];
    auVar5._16_8_ = local_4e0[lVar18 * 4 + 2];
    auVar5._24_8_ = local_4e0[lVar18 * 4 + 3];
    auVar4._8_8_ = auStack_4a0[lVar18 * 4 + 1];
    auVar4._0_8_ = auStack_4a0[lVar18 * 4];
    auVar4._16_8_ = auStack_4a0[lVar18 * 4 + 2];
    auVar4._24_8_ = auStack_4a0[lVar18 * 4 + 3];
    auVar1 = vpunpckldq_avx2(auVar5,auVar4);
    *(undefined1 (*) [32])(local_6e0 + (long)local_6e8 * 4) = auVar1;
    lVar18 = (long)local_6e8;
    auVar9._8_8_ = local_4e0[lVar18 * 4 + 1];
    auVar9._0_8_ = local_4e0[lVar18 * 4];
    auVar9._16_8_ = local_4e0[lVar18 * 4 + 2];
    auVar9._24_8_ = local_4e0[lVar18 * 4 + 3];
    auVar8._8_8_ = auStack_4a0[lVar18 * 4 + 1];
    auVar8._0_8_ = auStack_4a0[lVar18 * 4];
    auVar8._16_8_ = auStack_4a0[lVar18 * 4 + 2];
    auVar8._24_8_ = auStack_4a0[lVar18 * 4 + 3];
    auVar1 = vpunpckhdq_avx2(auVar9,auVar8);
    *(undefined1 (*) [32])(auStack_6a0 + (long)local_6e8 * 0x20) = auVar1;
    lVar18 = (long)local_6e8;
    auVar3._8_8_ = auStack_460[lVar18 * 4 + 1];
    auVar3._0_8_ = auStack_460[lVar18 * 4];
    auVar3._16_8_ = auStack_460[lVar18 * 4 + 2];
    auVar3._24_8_ = auStack_460[lVar18 * 4 + 3];
    auVar2._8_8_ = auStack_420[lVar18 * 4 + 1];
    auVar2._0_8_ = auStack_420[lVar18 * 4];
    auVar2._16_8_ = auStack_420[lVar18 * 4 + 2];
    auVar2._24_8_ = auStack_420[lVar18 * 4 + 3];
    auVar1 = vpunpckldq_avx2(auVar3,auVar2);
    *(undefined1 (*) [32])(auStack_660 + (long)local_6e8 * 4) = auVar1;
    lVar18 = (long)local_6e8;
    auVar7._8_8_ = auStack_460[lVar18 * 4 + 1];
    auVar7._0_8_ = auStack_460[lVar18 * 4];
    auVar7._16_8_ = auStack_460[lVar18 * 4 + 2];
    auVar7._24_8_ = auStack_460[lVar18 * 4 + 3];
    auVar6._8_8_ = auStack_420[lVar18 * 4 + 1];
    auVar6._0_8_ = auStack_420[lVar18 * 4];
    auVar6._16_8_ = auStack_420[lVar18 * 4 + 2];
    auVar6._24_8_ = auStack_420[lVar18 * 4 + 3];
    auVar1 = vpunpckhdq_avx2(auVar7,auVar6);
    *(undefined1 (*) [32])(local_6e0 + (long)(local_6e8 + 6) * 4) = auVar1;
  }
  for (local_6ec = 0; local_6ec < 2; local_6ec = local_6ec + 1) {
    lVar18 = (long)(local_6ec * 2);
    auVar12._8_8_ = local_6e0[lVar18 * 4 + 1];
    auVar12._0_8_ = local_6e0[lVar18 * 4];
    auVar12._16_8_ = local_6e0[lVar18 * 4 + 2];
    auVar12._24_8_ = local_6e0[lVar18 * 4 + 3];
    auVar11._8_8_ = auStack_660[lVar18 * 4 + 1];
    auVar11._0_8_ = auStack_660[lVar18 * 4];
    auVar11._16_8_ = auStack_660[lVar18 * 4 + 2];
    auVar11._24_8_ = auStack_660[lVar18 * 4 + 3];
    auVar1 = vpunpcklqdq_avx2(auVar12,auVar11);
    *(undefined1 (*) [32])(local_2d0 + (long)(local_6ec * 2) * 0x20) = auVar1;
    lVar18 = (long)(local_6ec * 2);
    auVar16._8_8_ = local_6e0[lVar18 * 4 + 1];
    auVar16._0_8_ = local_6e0[lVar18 * 4];
    auVar16._16_8_ = local_6e0[lVar18 * 4 + 2];
    auVar16._24_8_ = local_6e0[lVar18 * 4 + 3];
    auVar15._8_8_ = auStack_660[lVar18 * 4 + 1];
    auVar15._0_8_ = auStack_660[lVar18 * 4];
    auVar15._16_8_ = auStack_660[lVar18 * 4 + 2];
    auVar15._24_8_ = auStack_660[lVar18 * 4 + 3];
    auVar1 = vpunpckhqdq_avx2(auVar16,auVar15);
    *(undefined1 (*) [32])(local_2d0 + 0x20 + (long)(local_6ec * 2) * 0x20) = auVar1;
    lVar18 = (long)(local_6ec * 2);
    lVar17 = lVar18 * 0x20;
    auVar10._8_8_ = *(undefined8 *)(auStack_6a0 + lVar17 + -0x18);
    auVar10._0_8_ = local_6e0[lVar18 * 4 + 4];
    auVar10._16_8_ = *(undefined8 *)(auStack_6a0 + lVar17 + -0x10);
    auVar10._24_8_ = *(undefined8 *)(auStack_6a0 + lVar17 + -8);
    auVar1._8_8_ = auStack_660[lVar18 * 4 + 5];
    auVar1._0_8_ = auStack_660[lVar18 * 4 + 4];
    auVar1._16_8_ = auStack_660[lVar18 * 4 + 6];
    auVar1._24_8_ = auStack_660[lVar18 * 4 + 7];
    auVar1 = vpunpcklqdq_avx2(auVar10,auVar1);
    *(undefined1 (*) [32])((long)(local_6ec * 2) * 0x20 + 0x80 + local_2d0) = auVar1;
    lVar18 = (long)(local_6ec * 2);
    lVar17 = lVar18 * 0x20;
    auVar14._8_8_ = *(undefined8 *)(auStack_6a0 + lVar17 + -0x18);
    auVar14._0_8_ = local_6e0[lVar18 * 4 + 4];
    auVar14._16_8_ = *(undefined8 *)(auStack_6a0 + lVar17 + -0x10);
    auVar14._24_8_ = *(undefined8 *)(auStack_6a0 + lVar17 + -8);
    auVar13._8_8_ = auStack_660[lVar18 * 4 + 5];
    auVar13._0_8_ = auStack_660[lVar18 * 4 + 4];
    auVar13._16_8_ = auStack_660[lVar18 * 4 + 6];
    auVar13._24_8_ = auStack_660[lVar18 * 4 + 7];
    auVar1 = vpunpckhqdq_avx2(auVar14,auVar13);
    *(undefined1 (*) [32])(local_2d0 + (long)(local_6ec * 2 + 5) * 0x20) = auVar1;
  }
  return;
}

Assistant:

static inline void transpose2_8x8_avx2(const __m256i *const in,
                                       __m256i *const out) {
  __m256i t[16], u[16];
  // (1st, 2nd) ==> (lo, hi)
  //   (0, 1)   ==>  (0, 1)
  //   (2, 3)   ==>  (2, 3)
  //   (4, 5)   ==>  (4, 5)
  //   (6, 7)   ==>  (6, 7)
  for (int i = 0; i < 4; i++) {
    t[2 * i] = _mm256_unpacklo_epi16(in[2 * i], in[2 * i + 1]);
    t[2 * i + 1] = _mm256_unpackhi_epi16(in[2 * i], in[2 * i + 1]);
  }

  // (1st, 2nd) ==> (lo, hi)
  //   (0, 2)   ==>  (0, 2)
  //   (1, 3)   ==>  (1, 3)
  //   (4, 6)   ==>  (4, 6)
  //   (5, 7)   ==>  (5, 7)
  for (int i = 0; i < 2; i++) {
    u[i] = _mm256_unpacklo_epi32(t[i], t[i + 2]);
    u[i + 2] = _mm256_unpackhi_epi32(t[i], t[i + 2]);

    u[i + 4] = _mm256_unpacklo_epi32(t[i + 4], t[i + 6]);
    u[i + 6] = _mm256_unpackhi_epi32(t[i + 4], t[i + 6]);
  }

  // (1st, 2nd) ==> (lo, hi)
  //   (0, 4)   ==>  (0, 1)
  //   (1, 5)   ==>  (4, 5)
  //   (2, 6)   ==>  (2, 3)
  //   (3, 7)   ==>  (6, 7)
  for (int i = 0; i < 2; i++) {
    out[2 * i] = _mm256_unpacklo_epi64(u[2 * i], u[2 * i + 4]);
    out[2 * i + 1] = _mm256_unpackhi_epi64(u[2 * i], u[2 * i + 4]);

    out[2 * i + 4] = _mm256_unpacklo_epi64(u[2 * i + 1], u[2 * i + 5]);
    out[2 * i + 5] = _mm256_unpackhi_epi64(u[2 * i + 1], u[2 * i + 5]);
  }
}